

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::sortTags(Player *this)

{
  bool bVar1;
  iterator this_00;
  reference __args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar2;
  MessageHolder *ms;
  iterator __end2_1;
  iterator __begin2_1;
  vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *__range2_1;
  iterator fnd;
  ValueSetter *vs;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
  local_78;
  undefined1 *local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_68;
  undefined1 local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_50;
  reference local_48;
  ValueSetter *local_40;
  __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  MessageHolder *local_28;
  MessageHolder *local_20;
  ValueSetter *local_18;
  ValueSetter *local_10;
  
  local_10 = (ValueSetter *)
             CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ::begin((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      *)in_stack_ffffffffffffff58);
  local_18 = (ValueSetter *)
             CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ::end((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                   in_stack_ffffffffffffff58);
  std::
  sort<__gnu_cxx::__normal_iterator<helics::apps::ValueSetter*,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>,bool(*)(helics::apps::ValueSetter_const&,helics::apps::ValueSetter_const&)>
            ((__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
              )in_stack_ffffffffffffff80._M_current,
             (__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
              )in_stack_ffffffffffffff78._M_current,
             (_func_bool_ValueSetter_ptr_ValueSetter_ptr *)
             CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
  local_20 = (MessageHolder *)
             CLI::std::
             vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
             begin((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                    *)in_stack_ffffffffffffff58);
  local_28 = (MessageHolder *)
             CLI::std::
             vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::end
                       ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                         *)in_stack_ffffffffffffff58);
  std::
  sort<__gnu_cxx::__normal_iterator<helics::apps::MessageHolder*,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>,bool(*)(helics::apps::MessageHolder_const&,helics::apps::MessageHolder_const&)>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (_func_bool_MessageHolder_ptr_MessageHolder_ptr *)
             CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
  local_30 = in_RDI + 5;
  local_38._M_current =
       (ValueSetter *)
       CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
       begin((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             in_stack_ffffffffffffff58);
  local_40 = (ValueSetter *)
             CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ::end((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                   in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                           ((__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                             *)in_RDI,
                            (__normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
                             *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_48 = __gnu_cxx::
               __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
               ::operator*(&local_38);
    local_50._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffff58,(key_type *)0x17e184);
    local_58._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff58);
    bVar1 = CLI::std::__detail::operator==(&local_50,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pVar2 = std::
              unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,in_RDI);
      local_68._M_cur =
           (__node_type *)
           pVar2.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur;
      local_60 = pVar2.second;
    }
    else {
      CLI::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)0x17e1c0);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17e1cc);
      if (bVar1) {
        in_stack_ffffffffffffff58 = &local_48->type;
        CLI::std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_RDI,in_stack_ffffffffffffff58);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_RDI,in_stack_ffffffffffffff58);
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::ValueSetter_*,_std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>_>
    ::operator++(&local_38);
  }
  local_70 = (undefined1 *)((long)&in_RDI[5].field_2 + 8);
  local_78._M_current =
       (MessageHolder *)
       CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
       begin((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             in_stack_ffffffffffffff58);
  this_00 = CLI::std::
            vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::end
                      ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                           ((__normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                             *)in_RDI,
                            (__normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
                             *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
    __args = __gnu_cxx::
             __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
             ::operator*(&local_78);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<std::__cxx11::string&>
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    __gnu_cxx::
    __normal_iterator<helics::apps::MessageHolder_*,_std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>_>
    ::operator++(&local_78);
  }
  return;
}

Assistant:

void Player::sortTags()
{
    std::sort(points.begin(), points.end(), vComp);
    std::sort(messages.begin(), messages.end(), mComp);
    // collapse tags to the reduced list
    for (auto& vs : points) {
        auto fnd = tags.find(vs.pubName);
        if (fnd != tags.end()) {
            if (fnd->second.empty()) {
                tags[vs.pubName] = vs.type;
            }
        } else {
            tags.emplace(vs.pubName, vs.type);
        }
    }

    for (auto& ms : messages) {
        epts.emplace(ms.mess.source);
    }
}